

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall google::protobuf::io::CordInputStream::LoadChunkData(CordInputStream *this)

{
  size_t sVar1;
  size_t sVar2;
  reference rVar3;
  
  sVar1 = this->bytes_remaining_;
  if (sVar1 == 0) {
    sVar2 = 0;
  }
  else {
    rVar3 = absl::lts_20240722::Cord::ChunkIterator::operator*(&(this->it_).chunk_iterator_);
    sVar2 = rVar3._M_len;
    this->data_ = rVar3._M_str;
  }
  this->available_ = sVar2;
  this->size_ = sVar2;
  return sVar1 != 0;
}

Assistant:

bool CordInputStream::LoadChunkData() {
  if (bytes_remaining_ != 0) {
    absl::string_view sv = absl::Cord::ChunkRemaining(it_);
    data_ = sv.data();
    size_ = available_ = sv.size();
    return true;
  }
  size_ = available_ = 0;
  return false;
}